

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

cbtMatrix3x3 * __thiscall cbtMatrix3x3::operator+=(cbtMatrix3x3 *this,cbtMatrix3x3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar7 = *(undefined8 *)this->m_el[0].m_floats;
  uVar8 = *(undefined8 *)m->m_el[0].m_floats;
  fVar1 = this->m_el[0].m_floats[2];
  fVar2 = this->m_el[1].m_floats[2];
  fVar3 = this->m_el[2].m_floats[2];
  uVar9 = *(undefined8 *)m->m_el[2].m_floats;
  uVar10 = *(undefined8 *)this->m_el[2].m_floats;
  uVar11 = *(undefined8 *)this->m_el[1].m_floats;
  fVar4 = m->m_el[0].m_floats[2];
  fVar5 = m->m_el[1].m_floats[2];
  fVar6 = m->m_el[2].m_floats[2];
  auVar12._0_4_ = (float)uVar7 + (float)uVar8;
  auVar12._4_4_ = (float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar8 >> 0x20);
  auVar12._8_8_ = 0;
  uVar7 = *(undefined8 *)m->m_el[1].m_floats;
  auVar14._0_4_ = (float)uVar10 + (float)uVar9;
  auVar14._4_4_ = (float)((ulong)uVar10 >> 0x20) + (float)((ulong)uVar9 >> 0x20);
  auVar14._8_8_ = 0;
  uVar8 = vmovlps_avx(auVar12);
  *(undefined8 *)this->m_el[0].m_floats = uVar8;
  this->m_el[0].m_floats[2] = fVar1 + fVar4;
  this->m_el[0].m_floats[3] = 0.0;
  auVar13._0_4_ = (float)uVar11 + (float)uVar7;
  auVar13._4_4_ = (float)((ulong)uVar11 >> 0x20) + (float)((ulong)uVar7 >> 0x20);
  auVar13._8_8_ = 0;
  uVar7 = vmovlps_avx(auVar13);
  *(undefined8 *)this->m_el[1].m_floats = uVar7;
  this->m_el[1].m_floats[2] = fVar2 + fVar5;
  this->m_el[1].m_floats[3] = 0.0;
  uVar7 = vmovlps_avx(auVar14);
  *(undefined8 *)this->m_el[2].m_floats = uVar7;
  this->m_el[2].m_floats[2] = fVar3 + fVar6;
  this->m_el[2].m_floats[3] = 0.0;
  return this;
}

Assistant:

SIMD_FORCE_INLINE cbtMatrix3x3&
cbtMatrix3x3::operator+=(const cbtMatrix3x3& m)
{
#if (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)) || defined(BT_USE_NEON)
	m_el[0].mVec128 = m_el[0].mVec128 + m.m_el[0].mVec128;
	m_el[1].mVec128 = m_el[1].mVec128 + m.m_el[1].mVec128;
	m_el[2].mVec128 = m_el[2].mVec128 + m.m_el[2].mVec128;
#else
	setValue(
		m_el[0][0] + m.m_el[0][0],
		m_el[0][1] + m.m_el[0][1],
		m_el[0][2] + m.m_el[0][2],
		m_el[1][0] + m.m_el[1][0],
		m_el[1][1] + m.m_el[1][1],
		m_el[1][2] + m.m_el[1][2],
		m_el[2][0] + m.m_el[2][0],
		m_el[2][1] + m.m_el[2][1],
		m_el[2][2] + m.m_el[2][2]);
#endif
	return *this;
}